

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq_Pos_Table.cpp
# Opt level: O1

void __thiscall Eq_Pos_Table::Eq_Pos_Table(Eq_Pos_Table *this)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int unaff_R15D;
  initializer_list<Position> __l;
  initializer_list<Position> __l_00;
  initializer_list<Position> __l_01;
  initializer_list<Position> __l_02;
  initializer_list<Position> __l_03;
  vector<Position,_std::allocator<Position>_> blue_insert;
  int local_d0;
  Position local_cc;
  undefined4 local_c0;
  int local_bc;
  int local_b8;
  allocator_type local_b1;
  vector<Position,_std::allocator<Position>_> local_b0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  ulong local_88;
  int local_7c;
  int local_78;
  int local_74;
  vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
  *local_70;
  vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
  *local_68;
  vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
  *local_60;
  Eq_Pos_Table *local_58;
  ulong local_50;
  vector<Position,_std::allocator<Position>_> local_48;
  
  local_68 = (vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
              *)&this->yellow_eq;
  local_60 = (vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
              *)&this->red_eq;
  local_70 = (vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
              *)&this->green_eq;
  (this->green_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->green_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->red_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->green_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->red_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->red_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->yellow_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->yellow_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blue_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->yellow_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blue_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blue_eq).
  super__Vector_base<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c = 1;
  local_88 = 0;
  local_7c = 0;
  local_58 = this;
  do {
    local_90 = 6 - local_7c;
    local_94 = 5 - local_7c;
    local_98 = 4 - local_7c;
    local_78 = 3 - local_7c;
    uVar1 = 0;
    local_74 = 0;
    do {
      iVar3 = 3;
      switch(local_74) {
      case 0:
        unaff_R15D = local_78;
        break;
      case 2:
        iVar3 = 2;
      case 1:
        unaff_R15D = local_98;
        break;
      case 3:
        iVar3 = 2;
        unaff_R15D = local_94;
        break;
      case 4:
        iVar3 = 1;
        unaff_R15D = local_94;
        break;
      case 5:
        iVar3 = 1;
        unaff_R15D = local_90;
        break;
      case 6:
        iVar3 = 0;
        unaff_R15D = local_90;
        break;
      default:
        puts("Invalid position");
        iVar3 = local_d0;
      }
      iVar2 = (int)local_88 + (int)uVar1;
      iVar4 = (int)uVar1 + unaff_R15D * 2;
      local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = R;
      local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 1;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_b0;
      local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = iVar3;
      local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = iVar2;
      local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = unaff_R15D;
      local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = iVar4;
      local_50 = uVar1;
      std::vector<Position,_std::allocator<Position>_>::vector
                (&local_48,__l,(allocator_type *)&local_cc);
      local_cc.reference_corner = R;
      local_c0 = 1;
      __l_00._M_len = 2;
      __l_00._M_array = &local_cc;
      local_cc.layer = iVar3;
      local_cc.entry = iVar2;
      local_bc = unaff_R15D;
      local_b8 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_b0,__l_00,&local_b1);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>
                ((vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
                  *)local_58,&local_b0);
      if ((void *)CONCAT44(local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (Corner)local_b0.super__Vector_base<Position,_std::allocator<Position>_>.
                                   _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_b0.
                                         super__Vector_base<Position,_std::allocator<Position>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (Corner)local_b0.
                                                 super__Vector_base<Position,_std::allocator<Position>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
      }
      local_cc.reference_corner = L;
      local_c0 = 3;
      __l_01._M_len = 2;
      __l_01._M_array = &local_cc;
      local_cc.layer = iVar3;
      local_cc.entry = iVar2;
      local_bc = unaff_R15D;
      local_b8 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_b0,__l_01,&local_b1);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>(local_60,&local_b0);
      if ((void *)CONCAT44(local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (Corner)local_b0.super__Vector_base<Position,_std::allocator<Position>_>.
                                   _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_b0.
                                         super__Vector_base<Position,_std::allocator<Position>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (Corner)local_b0.
                                                 super__Vector_base<Position,_std::allocator<Position>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
      }
      local_cc.reference_corner = B;
      local_c0 = 2;
      __l_02._M_len = 2;
      __l_02._M_array = &local_cc;
      local_cc.layer = iVar3;
      local_cc.entry = iVar2;
      local_bc = unaff_R15D;
      local_b8 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_b0,__l_02,&local_b1);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>(local_68,&local_b0);
      if ((void *)CONCAT44(local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (Corner)local_b0.super__Vector_base<Position,_std::allocator<Position>_>.
                                   _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_b0.
                                         super__Vector_base<Position,_std::allocator<Position>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (Corner)local_b0.
                                                 super__Vector_base<Position,_std::allocator<Position>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
      }
      local_cc.reference_corner = L;
      local_c0 = 2;
      __l_03._M_len = 2;
      __l_03._M_array = &local_cc;
      local_cc.layer = iVar3;
      local_cc.entry = iVar2;
      local_bc = unaff_R15D;
      local_b8 = iVar4;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_b0,__l_03,&local_b1);
      std::
      vector<std::vector<Position,std::allocator<Position>>,std::allocator<std::vector<Position,std::allocator<Position>>>>
      ::emplace_back<std::vector<Position,std::allocator<Position>>>(local_70,&local_b0);
      if ((void *)CONCAT44(local_b0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (Corner)local_b0.super__Vector_base<Position,_std::allocator<Position>_>.
                                   _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_b0.
                                         super__Vector_base<Position,_std::allocator<Position>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (Corner)local_b0.
                                                 super__Vector_base<Position,_std::allocator<Position>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
      }
      uVar1 = local_50;
      iVar2 = local_74;
      if (local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_74 = iVar2 + 1;
      uVar1 = (ulong)((int)uVar1 - 1);
      local_d0 = iVar3;
    } while (local_8c != local_74);
    local_7c = local_7c + 1;
    local_8c = local_8c + 2;
    local_88 = (ulong)((int)local_88 + 2);
  } while (local_7c != 4);
  return;
}

Assistant:

Eq_Pos_Table::Eq_Pos_Table(){
    // Build the equivalent position tables
    for(int layer = 0; layer < 4; layer++){
        for(int entry = 0;  entry < (2*layer + 1); entry++){
            //int flat_entry = (layer*layer) + entry;
            Position eq1, eq2;
            switch (entry)
            {
            case 0:
                eq1.layer = 3;
                eq2.layer = 3-layer;
                break;
            case 1:
                eq1.layer = 3;
                eq2.layer = 4-layer;
                break;
            case 2:
                eq1.layer = 2;
                eq2.layer = 4-layer;
                break;
            case 3:
                eq1.layer = 2;
                eq2.layer = 5-layer;
                break;
            case 4:
                eq1.layer = 1;
                eq2.layer = 5-layer;
                break;
            case 5:
                eq1.layer = 1;
                eq2.layer = 6-layer;
                break;
            case 6:
                eq1.layer = 0;
                eq2.layer = 6-layer;
                break;
            default:
                printf("Invalid position\n");
                break;
            }
            eq1.entry = 2*layer  - entry;
            eq2.entry = 2*(eq2.layer)  - entry;

            
            eq1.reference_corner = Corner::R;
            eq2.reference_corner = Corner::L;
            std::vector<Position> blue_insert{eq1, eq2};
            blue_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::L;
            eq2.reference_corner = Corner::B;
            red_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::B;
            eq2.reference_corner = Corner::R;
            yellow_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::L;
            eq2.reference_corner = Corner::R;
            green_eq.push_back(std::vector<Position>{eq1, eq2});
        }
    }
}